

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  undefined4 uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  float fVar26;
  float fVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  float fVar36;
  float fVar42;
  float fVar43;
  undefined1 auVar37 [16];
  float fVar44;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar66;
  float fVar68;
  undefined1 auVar58 [16];
  float fVar71;
  undefined1 auVar59 [16];
  float fVar67;
  float fVar69;
  float fVar72;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar70;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar73;
  float fVar77;
  float fVar78;
  undefined1 auVar74 [16];
  float fVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [16];
  float fVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  float fVar92;
  float fVar103;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar100 [64];
  float fVar104;
  undefined1 auVar105 [16];
  float fVar115;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  float fVar114;
  undefined1 auVar112 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [64];
  float fVar137;
  float fVar142;
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [64];
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27a1;
  undefined8 local_27a0;
  float fStack_2798;
  float fStack_2794;
  undefined8 local_2790;
  float fStack_2788;
  float fStack_2784;
  size_t local_2780;
  RayHitK<4> *local_2778;
  long local_2770;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  long local_2748;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  Scene *local_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [16];
  undefined1 (*local_26e8) [16];
  long local_26e0;
  ulong local_26d8;
  RTCFilterFunctionNArguments local_26d0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [16];
  undefined1 *local_2670;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [2] [16];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  RTCHitN local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar24 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar16;
  local_23c0._0_4_ = uVar16;
  local_23c0._8_4_ = uVar16;
  local_23c0._12_4_ = uVar16;
  local_23c0._16_4_ = uVar16;
  local_23c0._20_4_ = uVar16;
  local_23c0._24_4_ = uVar16;
  local_23c0._28_4_ = uVar16;
  auVar100 = ZEXT3264(local_23c0);
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar16;
  local_23e0._0_4_ = uVar16;
  local_23e0._8_4_ = uVar16;
  local_23e0._12_4_ = uVar16;
  local_23e0._16_4_ = uVar16;
  local_23e0._20_4_ = uVar16;
  local_23e0._24_4_ = uVar16;
  local_23e0._28_4_ = uVar16;
  auVar112 = ZEXT3264(local_23e0);
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar16;
  local_2400._0_4_ = uVar16;
  local_2400._8_4_ = uVar16;
  local_2400._12_4_ = uVar16;
  local_2400._16_4_ = uVar16;
  local_2400._20_4_ = uVar16;
  local_2400._24_4_ = uVar16;
  local_2400._28_4_ = uVar16;
  auVar119 = ZEXT3264(local_2400);
  fVar26 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar36 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar35 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar27 = ZEXT416((uint)(fVar26 * 0.99999964));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_2420._16_16_ = auVar27;
  local_2420._0_16_ = auVar27;
  auVar121 = ZEXT3264(local_2420);
  auVar27 = ZEXT416((uint)(fVar36 * 0.99999964));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_2440._16_16_ = auVar27;
  local_2440._0_16_ = auVar27;
  auVar126 = ZEXT3264(local_2440);
  auVar27 = ZEXT416((uint)(fVar35 * 0.99999964));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_2460._16_16_ = auVar27;
  local_2460._0_16_ = auVar27;
  auVar130 = ZEXT3264(local_2460);
  auVar27 = ZEXT416((uint)(fVar26 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_2480._16_16_ = auVar27;
  local_2480._0_16_ = auVar27;
  auVar133 = ZEXT3264(local_2480);
  auVar27 = ZEXT416((uint)(fVar36 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_24a0._16_16_ = auVar27;
  local_24a0._0_16_ = auVar27;
  auVar139 = ZEXT3264(local_24a0);
  auVar27 = ZEXT416((uint)(fVar35 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  local_24c0._16_16_ = auVar27;
  local_24c0._0_16_ = auVar27;
  auVar145 = ZEXT3264(local_24c0);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_26d8 = uVar21 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_25e0._4_4_ = iVar1;
  local_25e0._0_4_ = iVar1;
  local_25e0._8_4_ = iVar1;
  local_25e0._12_4_ = iVar1;
  local_25e0._16_4_ = iVar1;
  local_25e0._20_4_ = iVar1;
  local_25e0._24_4_ = iVar1;
  local_25e0._28_4_ = iVar1;
  auVar91 = ZEXT3264(local_25e0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar34 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_26e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_2780 = k;
  local_2778 = ray;
LAB_00fdb17d:
  do {
    do {
      if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar17 = pauVar24 + -1;
      pauVar24 = pauVar24 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar17 + 8));
    uVar18 = *(ulong *)*pauVar24;
    while ((uVar18 & 8) == 0) {
      auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar21),auVar100._0_32_);
      auVar9._4_4_ = auVar121._4_4_ * auVar8._4_4_;
      auVar9._0_4_ = auVar121._0_4_ * auVar8._0_4_;
      auVar9._8_4_ = auVar121._8_4_ * auVar8._8_4_;
      auVar9._12_4_ = auVar121._12_4_ * auVar8._12_4_;
      auVar9._16_4_ = auVar121._16_4_ * auVar8._16_4_;
      auVar9._20_4_ = auVar121._20_4_ * auVar8._20_4_;
      auVar9._24_4_ = auVar121._24_4_ * auVar8._24_4_;
      auVar9._28_4_ = auVar8._28_4_;
      auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar23),auVar112._0_32_);
      auVar10._4_4_ = auVar126._4_4_ * auVar8._4_4_;
      auVar10._0_4_ = auVar126._0_4_ * auVar8._0_4_;
      auVar10._8_4_ = auVar126._8_4_ * auVar8._8_4_;
      auVar10._12_4_ = auVar126._12_4_ * auVar8._12_4_;
      auVar10._16_4_ = auVar126._16_4_ * auVar8._16_4_;
      auVar10._20_4_ = auVar126._20_4_ * auVar8._20_4_;
      auVar10._24_4_ = auVar126._24_4_ * auVar8._24_4_;
      auVar10._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar9,auVar10);
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar20),auVar119._0_32_);
      auVar11._4_4_ = auVar130._4_4_ * auVar9._4_4_;
      auVar11._0_4_ = auVar130._0_4_ * auVar9._0_4_;
      auVar11._8_4_ = auVar130._8_4_ * auVar9._8_4_;
      auVar11._12_4_ = auVar130._12_4_ * auVar9._12_4_;
      auVar11._16_4_ = auVar130._16_4_ * auVar9._16_4_;
      auVar11._20_4_ = auVar130._20_4_ * auVar9._20_4_;
      auVar11._24_4_ = auVar130._24_4_ * auVar9._24_4_;
      auVar11._28_4_ = auVar9._28_4_;
      auVar9 = vmaxps_avx(auVar11,auVar91._0_32_);
      local_26a0 = vmaxps_avx(auVar8,auVar9);
      auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + local_26d8),auVar100._0_32_);
      auVar12._4_4_ = auVar133._4_4_ * auVar8._4_4_;
      auVar12._0_4_ = auVar133._0_4_ * auVar8._0_4_;
      auVar12._8_4_ = auVar133._8_4_ * auVar8._8_4_;
      auVar12._12_4_ = auVar133._12_4_ * auVar8._12_4_;
      auVar12._16_4_ = auVar133._16_4_ * auVar8._16_4_;
      auVar12._20_4_ = auVar133._20_4_ * auVar8._20_4_;
      auVar12._24_4_ = auVar133._24_4_ * auVar8._24_4_;
      auVar12._28_4_ = auVar8._28_4_;
      auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar23 ^ 0x20)),auVar112._0_32_);
      auVar13._4_4_ = auVar139._4_4_ * auVar8._4_4_;
      auVar13._0_4_ = auVar139._0_4_ * auVar8._0_4_;
      auVar13._8_4_ = auVar139._8_4_ * auVar8._8_4_;
      auVar13._12_4_ = auVar139._12_4_ * auVar8._12_4_;
      auVar13._16_4_ = auVar139._16_4_ * auVar8._16_4_;
      auVar13._20_4_ = auVar139._20_4_ * auVar8._20_4_;
      auVar13._24_4_ = auVar139._24_4_ * auVar8._24_4_;
      auVar13._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar12,auVar13);
      auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar20 ^ 0x20)),auVar119._0_32_);
      auVar14._4_4_ = auVar145._4_4_ * auVar9._4_4_;
      auVar14._0_4_ = auVar145._0_4_ * auVar9._0_4_;
      auVar14._8_4_ = auVar145._8_4_ * auVar9._8_4_;
      auVar14._12_4_ = auVar145._12_4_ * auVar9._12_4_;
      auVar14._16_4_ = auVar145._16_4_ * auVar9._16_4_;
      auVar14._20_4_ = auVar145._20_4_ * auVar9._20_4_;
      auVar14._24_4_ = auVar145._24_4_ * auVar9._24_4_;
      auVar14._28_4_ = auVar9._28_4_;
      auVar9 = vminps_avx(auVar14,auVar34._0_32_);
      auVar8 = vminps_avx(auVar8,auVar9);
      auVar8 = vcmpps_avx(local_26a0,auVar8,2);
      uVar15 = vmovmskps_avx(auVar8);
      if (uVar15 == 0) goto LAB_00fdb17d;
      uVar15 = uVar15 & 0xff;
      uVar25 = uVar18 & 0xfffffffffffffff0;
      lVar19 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar18 = *(ulong *)(uVar25 + lVar19 * 8);
      uVar15 = uVar15 - 1 & uVar15;
      if (uVar15 != 0) {
        uVar3 = *(uint *)(local_26a0 + lVar19 * 4);
        lVar19 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar5 = *(ulong *)(uVar25 + lVar19 * 8);
        uVar4 = *(uint *)(local_26a0 + lVar19 * 4);
        uVar15 = uVar15 - 1 & uVar15;
        if (uVar15 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar24 = uVar5;
            *(uint *)(*pauVar24 + 8) = uVar4;
            pauVar24 = pauVar24 + 1;
          }
          else {
            *(ulong *)*pauVar24 = uVar18;
            *(uint *)(*pauVar24 + 8) = uVar3;
            pauVar24 = pauVar24 + 1;
            uVar18 = uVar5;
          }
        }
        else {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar18;
          auVar27 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar3));
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar5;
          auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar4));
          lVar19 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(uVar25 + lVar19 * 8);
          auVar37 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_26a0 + lVar19 * 4)));
          auVar58 = vpcmpgtd_avx(auVar45,auVar27);
          uVar15 = uVar15 - 1 & uVar15;
          if (uVar15 == 0) {
            auVar81 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar45,auVar27,auVar81);
            auVar27 = vblendvps_avx(auVar27,auVar45,auVar81);
            auVar45 = vpcmpgtd_avx(auVar37,auVar58);
            auVar81 = vpshufd_avx(auVar45,0xaa);
            auVar45 = vblendvps_avx(auVar37,auVar58,auVar81);
            auVar58 = vblendvps_avx(auVar58,auVar37,auVar81);
            auVar37 = vpcmpgtd_avx(auVar58,auVar27);
            auVar81 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar58,auVar27,auVar81);
            auVar27 = vblendvps_avx(auVar27,auVar58,auVar81);
            *pauVar24 = auVar27;
            pauVar24[1] = auVar37;
            uVar18 = auVar45._0_8_;
            pauVar24 = pauVar24 + 2;
          }
          else {
            lVar19 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)(uVar25 + lVar19 * 8);
            auVar81 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_26a0 + lVar19 * 4)));
            uVar15 = uVar15 - 1 & uVar15;
            uVar18 = (ulong)uVar15;
            if (uVar15 == 0) {
              auVar28 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar45,auVar27,auVar28);
              auVar27 = vblendvps_avx(auVar27,auVar45,auVar28);
              auVar45 = vpcmpgtd_avx(auVar81,auVar37);
              auVar28 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar81,auVar37,auVar28);
              auVar37 = vblendvps_avx(auVar37,auVar81,auVar28);
              auVar81 = vpcmpgtd_avx(auVar37,auVar27);
              auVar28 = vpshufd_avx(auVar81,0xaa);
              auVar81 = vblendvps_avx(auVar37,auVar27,auVar28);
              auVar27 = vblendvps_avx(auVar27,auVar37,auVar28);
              auVar37 = vpcmpgtd_avx(auVar45,auVar58);
              auVar28 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar45,auVar58,auVar28);
              auVar45 = vblendvps_avx(auVar58,auVar45,auVar28);
              auVar58 = vpcmpgtd_avx(auVar81,auVar45);
              auVar28 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar81,auVar45,auVar28);
              auVar45 = vblendvps_avx(auVar45,auVar81,auVar28);
              *pauVar24 = auVar27;
              pauVar24[1] = auVar45;
              pauVar24[2] = auVar58;
              uVar18 = auVar37._0_8_;
              pauVar17 = pauVar24 + 3;
            }
            else {
              *pauVar24 = auVar27;
              pauVar24[1] = auVar45;
              pauVar24[2] = auVar37;
              pauVar17 = pauVar24 + 3;
              pauVar24[3] = auVar81;
              do {
                lVar19 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar25 + lVar19 * 8);
                auVar27 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_26a0 + lVar19 * 4)));
                pauVar17[1] = auVar27;
                pauVar17 = pauVar17 + 1;
                uVar18 = uVar18 & uVar18 - 1;
              } while (uVar18 != 0);
              lVar19 = 0;
              while (pauVar17 != pauVar24) {
                auVar27 = pauVar24[1];
                uVar15 = vextractps_avx(auVar27,2);
                for (lVar22 = 0x10;
                    (lVar19 != lVar22 && (*(uint *)(pauVar24[-1] + lVar22 + 8) < uVar15));
                    lVar22 = lVar22 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar24 + lVar22) =
                       *(undefined1 (*) [16])(pauVar24[-1] + lVar22);
                }
                *(undefined1 (*) [16])(*pauVar24 + lVar22) = auVar27;
                lVar19 = lVar19 + -0x10;
                pauVar24 = pauVar24 + 1;
              }
              uVar18 = *(ulong *)*pauVar17;
              ray = local_2778;
              k = local_2780;
            }
            auVar91 = ZEXT3264(local_25e0);
            pauVar24 = pauVar17;
          }
        }
      }
    }
    local_26e0 = (ulong)((uint)uVar18 & 0xf) - 8;
    uVar18 = uVar18 & 0xfffffffffffffff0;
    for (lVar19 = 0; lVar19 != local_26e0; lVar19 = lVar19 + 1) {
      lVar22 = lVar19 * 0xb0;
      uVar16 = *(undefined4 *)(ray + k * 4);
      auVar28._4_4_ = uVar16;
      auVar28._0_4_ = uVar16;
      auVar28._8_4_ = uVar16;
      auVar28._12_4_ = uVar16;
      uVar16 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar46._4_4_ = uVar16;
      auVar46._0_4_ = uVar16;
      auVar46._8_4_ = uVar16;
      auVar46._12_4_ = uVar16;
      uVar16 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar74._4_4_ = uVar16;
      auVar74._0_4_ = uVar16;
      auVar74._8_4_ = uVar16;
      auVar74._12_4_ = uVar16;
      local_2720 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + lVar22),auVar28);
      auVar27 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x10 + lVar22),auVar46);
      auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + lVar22),auVar74);
      auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x30 + lVar22),auVar28);
      auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x40 + lVar22),auVar46);
      auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x50 + lVar22),auVar74);
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x60 + lVar22),auVar28);
      auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x70 + lVar22),auVar46);
      auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x80 + lVar22),auVar74);
      local_2560 = vsubps_avx(auVar28,local_2720);
      local_2570 = vsubps_avx(auVar46,auVar27);
      local_2580 = vsubps_avx(auVar74,auVar45);
      fVar55 = auVar27._0_4_;
      fVar36 = fVar55 + auVar46._0_4_;
      fVar66 = auVar27._4_4_;
      fVar42 = fVar66 + auVar46._4_4_;
      fVar68 = auVar27._8_4_;
      fVar43 = fVar68 + auVar46._8_4_;
      fVar71 = auVar27._12_4_;
      fVar44 = fVar71 + auVar46._12_4_;
      fVar137 = auVar45._0_4_;
      fVar73 = fVar137 + auVar74._0_4_;
      fVar140 = auVar45._4_4_;
      fVar77 = fVar140 + auVar74._4_4_;
      fVar141 = auVar45._8_4_;
      fVar78 = fVar141 + auVar74._8_4_;
      fVar142 = auVar45._12_4_;
      fVar79 = fVar142 + auVar74._12_4_;
      fVar26 = local_2580._0_4_;
      auVar105._0_4_ = fVar36 * fVar26;
      fVar35 = local_2580._4_4_;
      auVar105._4_4_ = fVar42 * fVar35;
      fVar57 = local_2580._8_4_;
      auVar105._8_4_ = fVar43 * fVar57;
      fVar70 = local_2580._12_4_;
      auVar105._12_4_ = fVar44 * fVar70;
      fVar143 = local_2570._0_4_;
      auVar116._0_4_ = fVar143 * fVar73;
      fVar146 = local_2570._4_4_;
      auVar116._4_4_ = fVar146 * fVar77;
      fVar148 = local_2570._8_4_;
      auVar116._8_4_ = fVar148 * fVar78;
      fVar150 = local_2570._12_4_;
      auVar116._12_4_ = fVar150 * fVar79;
      auVar30 = vsubps_avx(auVar116,auVar105);
      fVar92 = local_2720._0_4_;
      fVar104 = fVar92 + auVar28._0_4_;
      fVar101 = local_2720._4_4_;
      fVar113 = fVar101 + auVar28._4_4_;
      fVar102 = local_2720._8_4_;
      fVar114 = fVar102 + auVar28._8_4_;
      fVar103 = local_2720._12_4_;
      fVar115 = fVar103 + auVar28._12_4_;
      fVar120 = local_2560._0_4_;
      auVar75._0_4_ = fVar120 * fVar73;
      fVar122 = local_2560._4_4_;
      auVar75._4_4_ = fVar122 * fVar77;
      fVar123 = local_2560._8_4_;
      auVar75._8_4_ = fVar123 * fVar78;
      fVar124 = local_2560._12_4_;
      auVar75._12_4_ = fVar124 * fVar79;
      auVar117._0_4_ = fVar104 * fVar26;
      auVar117._4_4_ = fVar113 * fVar35;
      auVar117._8_4_ = fVar114 * fVar57;
      auVar117._12_4_ = fVar115 * fVar70;
      auVar47 = vsubps_avx(auVar117,auVar75);
      auVar106._0_4_ = fVar104 * fVar143;
      auVar106._4_4_ = fVar113 * fVar146;
      auVar106._8_4_ = fVar114 * fVar148;
      auVar106._12_4_ = fVar115 * fVar150;
      auVar29._0_4_ = fVar120 * fVar36;
      auVar29._4_4_ = fVar122 * fVar42;
      auVar29._8_4_ = fVar123 * fVar43;
      auVar29._12_4_ = fVar124 * fVar44;
      auVar29 = vsubps_avx(auVar29,auVar106);
      local_2790._4_4_ = *(float *)(ray + k * 4 + 0x60);
      fStack_2768 = *(float *)(ray + k * 4 + 0x50);
      local_27a0._4_4_ = *(float *)(ray + k * 4 + 0x40);
      local_25a0._0_4_ =
           auVar30._0_4_ * local_27a0._4_4_ +
           local_2790._4_4_ * auVar29._0_4_ + fStack_2768 * auVar47._0_4_;
      local_25a0._4_4_ =
           auVar30._4_4_ * local_27a0._4_4_ +
           local_2790._4_4_ * auVar29._4_4_ + fStack_2768 * auVar47._4_4_;
      local_25a0._8_4_ =
           auVar30._8_4_ * local_27a0._4_4_ +
           local_2790._4_4_ * auVar29._8_4_ + fStack_2768 * auVar47._8_4_;
      local_25a0._12_4_ =
           auVar30._12_4_ * local_27a0._4_4_ +
           local_2790._4_4_ * auVar29._12_4_ + fStack_2768 * auVar47._12_4_;
      local_2590 = vsubps_avx(auVar27,auVar37);
      auVar27 = vsubps_avx(auVar45,auVar81);
      fVar36 = auVar37._0_4_ + fVar55;
      fVar42 = auVar37._4_4_ + fVar66;
      fVar43 = auVar37._8_4_ + fVar68;
      fVar44 = auVar37._12_4_ + fVar71;
      fVar73 = fVar137 + auVar81._0_4_;
      fVar77 = fVar140 + auVar81._4_4_;
      fVar78 = fVar141 + auVar81._8_4_;
      fVar79 = fVar142 + auVar81._12_4_;
      fVar144 = auVar27._0_4_;
      auVar138._0_4_ = fVar144 * fVar36;
      fVar147 = auVar27._4_4_;
      auVar138._4_4_ = fVar147 * fVar42;
      fVar149 = auVar27._8_4_;
      auVar138._8_4_ = fVar149 * fVar43;
      fVar151 = auVar27._12_4_;
      auVar138._12_4_ = fVar151 * fVar44;
      fVar131 = local_2590._0_4_;
      auVar59._0_4_ = fVar131 * fVar73;
      fVar134 = local_2590._4_4_;
      auVar59._4_4_ = fVar134 * fVar77;
      fVar135 = local_2590._8_4_;
      auVar59._8_4_ = fVar135 * fVar78;
      fVar136 = local_2590._12_4_;
      auVar59._12_4_ = fVar136 * fVar79;
      auVar27 = vsubps_avx(auVar59,auVar138);
      auVar45 = vsubps_avx(local_2720,auVar58);
      fVar125 = auVar45._0_4_;
      auVar76._0_4_ = fVar125 * fVar73;
      fVar127 = auVar45._4_4_;
      auVar76._4_4_ = fVar127 * fVar77;
      fVar128 = auVar45._8_4_;
      auVar76._8_4_ = fVar128 * fVar78;
      fVar129 = auVar45._12_4_;
      auVar76._12_4_ = fVar129 * fVar79;
      fVar73 = auVar58._0_4_ + fVar92;
      fVar77 = auVar58._4_4_ + fVar101;
      fVar78 = auVar58._8_4_ + fVar102;
      fVar79 = auVar58._12_4_ + fVar103;
      auVar107._0_4_ = fVar144 * fVar73;
      auVar107._4_4_ = fVar147 * fVar77;
      auVar107._8_4_ = fVar149 * fVar78;
      auVar107._12_4_ = fVar151 * fVar79;
      auVar45 = vsubps_avx(auVar107,auVar76);
      auVar93._0_4_ = fVar131 * fVar73;
      auVar93._4_4_ = fVar134 * fVar77;
      auVar93._8_4_ = fVar135 * fVar78;
      auVar93._12_4_ = fVar136 * fVar79;
      auVar30._0_4_ = fVar125 * fVar36;
      auVar30._4_4_ = fVar127 * fVar42;
      auVar30._8_4_ = fVar128 * fVar43;
      auVar30._12_4_ = fVar129 * fVar44;
      auVar30 = vsubps_avx(auVar30,auVar93);
      local_25b0._0_4_ =
           local_27a0._4_4_ * auVar27._0_4_ +
           local_2790._4_4_ * auVar30._0_4_ + fStack_2768 * auVar45._0_4_;
      local_25b0._4_4_ =
           local_27a0._4_4_ * auVar27._4_4_ +
           local_2790._4_4_ * auVar30._4_4_ + fStack_2768 * auVar45._4_4_;
      local_25b0._8_4_ =
           local_27a0._4_4_ * auVar27._8_4_ +
           local_2790._4_4_ * auVar30._8_4_ + fStack_2768 * auVar45._8_4_;
      local_25b0._12_4_ =
           local_27a0._4_4_ * auVar27._12_4_ +
           local_2790._4_4_ * auVar30._12_4_ + fStack_2768 * auVar45._12_4_;
      auVar27 = vsubps_avx(auVar58,auVar28);
      fVar56 = auVar58._0_4_ + auVar28._0_4_;
      fVar67 = auVar58._4_4_ + auVar28._4_4_;
      fVar69 = auVar58._8_4_ + auVar28._8_4_;
      fVar72 = auVar58._12_4_ + auVar28._12_4_;
      auVar45 = vsubps_avx(auVar37,auVar46);
      fVar80 = auVar37._0_4_ + auVar46._0_4_;
      fVar86 = auVar37._4_4_ + auVar46._4_4_;
      fVar87 = auVar37._8_4_ + auVar46._8_4_;
      fVar88 = auVar37._12_4_ + auVar46._12_4_;
      auVar58 = vsubps_avx(auVar81,auVar74);
      fVar104 = auVar81._0_4_ + auVar74._0_4_;
      fVar113 = auVar81._4_4_ + auVar74._4_4_;
      fVar114 = auVar81._8_4_ + auVar74._8_4_;
      fVar115 = auVar81._12_4_ + auVar74._12_4_;
      fVar36 = auVar58._0_4_;
      auVar94._0_4_ = fVar80 * fVar36;
      fVar42 = auVar58._4_4_;
      auVar94._4_4_ = fVar86 * fVar42;
      fVar43 = auVar58._8_4_;
      auVar94._8_4_ = fVar87 * fVar43;
      fVar44 = auVar58._12_4_;
      auVar94._12_4_ = fVar88 * fVar44;
      fVar73 = auVar45._0_4_;
      auVar108._0_4_ = fVar73 * fVar104;
      fVar77 = auVar45._4_4_;
      auVar108._4_4_ = fVar77 * fVar113;
      fVar78 = auVar45._8_4_;
      auVar108._8_4_ = fVar78 * fVar114;
      fVar79 = auVar45._12_4_;
      auVar108._12_4_ = fVar79 * fVar115;
      auVar45 = vsubps_avx(auVar108,auVar94);
      fVar132 = auVar27._0_4_;
      auVar47._0_4_ = fVar132 * fVar104;
      fVar104 = auVar27._4_4_;
      auVar47._4_4_ = fVar104 * fVar113;
      fVar113 = auVar27._8_4_;
      auVar47._8_4_ = fVar113 * fVar114;
      fVar114 = auVar27._12_4_;
      auVar47._12_4_ = fVar114 * fVar115;
      auVar109._0_4_ = fVar56 * fVar36;
      auVar109._4_4_ = fVar67 * fVar42;
      auVar109._8_4_ = fVar69 * fVar43;
      auVar109._12_4_ = fVar72 * fVar44;
      auVar27 = vsubps_avx(auVar109,auVar47);
      auVar60._0_4_ = fVar56 * fVar73;
      auVar60._4_4_ = fVar67 * fVar77;
      auVar60._8_4_ = fVar69 * fVar78;
      auVar60._12_4_ = fVar72 * fVar79;
      auVar82._0_4_ = fVar132 * fVar80;
      auVar82._4_4_ = fVar104 * fVar86;
      auVar82._8_4_ = fVar113 * fVar87;
      auVar82._12_4_ = fVar114 * fVar88;
      auVar58 = vsubps_avx(auVar82,auVar60);
      local_2790._0_4_ = local_2790._4_4_;
      fStack_2788 = local_2790._4_4_;
      fStack_2784 = local_2790._4_4_;
      local_27a0._0_4_ = local_27a0._4_4_;
      fStack_2798 = local_27a0._4_4_;
      fStack_2794 = local_27a0._4_4_;
      auVar48._0_4_ =
           local_27a0._4_4_ * auVar45._0_4_ +
           local_2790._4_4_ * auVar58._0_4_ + fStack_2768 * auVar27._0_4_;
      auVar48._4_4_ =
           local_27a0._4_4_ * auVar45._4_4_ +
           local_2790._4_4_ * auVar58._4_4_ + fStack_2768 * auVar27._4_4_;
      auVar48._8_4_ =
           local_27a0._4_4_ * auVar45._8_4_ +
           local_2790._4_4_ * auVar58._8_4_ + fStack_2768 * auVar27._8_4_;
      auVar48._12_4_ =
           local_27a0._4_4_ * auVar45._12_4_ +
           local_2790._4_4_ * auVar58._12_4_ + fStack_2768 * auVar27._12_4_;
      local_2680._0_4_ = auVar48._0_4_ + local_25a0._0_4_ + local_25b0._0_4_;
      local_2680._4_4_ = auVar48._4_4_ + local_25a0._4_4_ + local_25b0._4_4_;
      local_2680._8_4_ = auVar48._8_4_ + local_25a0._8_4_ + local_25b0._8_4_;
      local_2680._12_4_ = auVar48._12_4_ + local_25a0._12_4_ + local_25b0._12_4_;
      auVar27 = vminps_avx(local_25a0,local_25b0);
      auVar27 = vminps_avx(auVar27,auVar48);
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      local_25c0 = vandps_avx(local_2680,auVar83);
      auVar84._0_4_ = local_25c0._0_4_ * 1.1920929e-07;
      auVar84._4_4_ = local_25c0._4_4_ * 1.1920929e-07;
      auVar84._8_4_ = local_25c0._8_4_ * 1.1920929e-07;
      auVar84._12_4_ = local_25c0._12_4_ * 1.1920929e-07;
      uVar25 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
      auVar95._0_8_ = uVar25 ^ 0x8000000080000000;
      auVar95._8_4_ = -auVar84._8_4_;
      auVar95._12_4_ = -auVar84._12_4_;
      auVar27 = vcmpps_avx(auVar27,auVar95,5);
      auVar45 = vmaxps_avx(local_25a0,local_25b0);
      auVar45 = vmaxps_avx(auVar45,auVar48);
      auVar45 = vcmpps_avx(auVar45,auVar84,2);
      auVar27 = vorps_avx(auVar27,auVar45);
      if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0'
         ) {
        auVar49._0_4_ = fVar131 * fVar26;
        auVar49._4_4_ = fVar134 * fVar35;
        auVar49._8_4_ = fVar135 * fVar57;
        auVar49._12_4_ = fVar136 * fVar70;
        auVar61._0_4_ = fVar144 * fVar143;
        auVar61._4_4_ = fVar147 * fVar146;
        auVar61._8_4_ = fVar149 * fVar148;
        auVar61._12_4_ = fVar151 * fVar150;
        auVar37 = vsubps_avx(auVar61,auVar49);
        auVar85._0_4_ = fVar144 * fVar73;
        auVar85._4_4_ = fVar147 * fVar77;
        auVar85._8_4_ = fVar149 * fVar78;
        auVar85._12_4_ = fVar151 * fVar79;
        auVar96._0_4_ = fVar131 * fVar36;
        auVar96._4_4_ = fVar134 * fVar42;
        auVar96._8_4_ = fVar135 * fVar43;
        auVar96._12_4_ = fVar136 * fVar44;
        auVar81 = vsubps_avx(auVar96,auVar85);
        auVar110._8_4_ = 0x7fffffff;
        auVar110._0_8_ = 0x7fffffff7fffffff;
        auVar110._12_4_ = 0x7fffffff;
        auVar45 = vandps_avx(auVar110,auVar49);
        auVar58 = vandps_avx(auVar110,auVar85);
        auVar45 = vcmpps_avx(auVar45,auVar58,1);
        local_2620 = vblendvps_avx(auVar81,auVar37,auVar45);
        auVar50._0_4_ = fVar125 * fVar36;
        auVar50._4_4_ = fVar127 * fVar42;
        auVar50._8_4_ = fVar128 * fVar43;
        auVar50._12_4_ = fVar129 * fVar44;
        auVar62._0_4_ = fVar125 * fVar26;
        auVar62._4_4_ = fVar127 * fVar35;
        auVar62._8_4_ = fVar128 * fVar57;
        auVar62._12_4_ = fVar129 * fVar70;
        auVar89._0_4_ = fVar144 * fVar120;
        auVar89._4_4_ = fVar147 * fVar122;
        auVar89._8_4_ = fVar149 * fVar123;
        auVar89._12_4_ = fVar151 * fVar124;
        auVar37 = vsubps_avx(auVar62,auVar89);
        auVar97._0_4_ = fVar144 * fVar132;
        auVar97._4_4_ = fVar147 * fVar104;
        auVar97._8_4_ = fVar149 * fVar113;
        auVar97._12_4_ = fVar151 * fVar114;
        auVar81 = vsubps_avx(auVar97,auVar50);
        auVar45 = vandps_avx(auVar110,auVar89);
        auVar58 = vandps_avx(auVar110,auVar50);
        auVar45 = vcmpps_avx(auVar45,auVar58,1);
        local_2610 = vblendvps_avx(auVar81,auVar37,auVar45);
        auVar31._0_4_ = fVar131 * fVar132;
        auVar31._4_4_ = fVar134 * fVar104;
        auVar31._8_4_ = fVar135 * fVar113;
        auVar31._12_4_ = fVar136 * fVar114;
        auVar63._0_4_ = fVar131 * fVar120;
        auVar63._4_4_ = fVar134 * fVar122;
        auVar63._8_4_ = fVar135 * fVar123;
        auVar63._12_4_ = fVar136 * fVar124;
        auVar90._0_4_ = fVar125 * fVar143;
        auVar90._4_4_ = fVar127 * fVar146;
        auVar90._8_4_ = fVar128 * fVar148;
        auVar90._12_4_ = fVar129 * fVar150;
        auVar38._0_4_ = fVar125 * fVar73;
        auVar38._4_4_ = fVar127 * fVar77;
        auVar38._8_4_ = fVar128 * fVar78;
        auVar38._12_4_ = fVar129 * fVar79;
        auVar37 = vsubps_avx(auVar63,auVar90);
        auVar81 = vsubps_avx(auVar38,auVar31);
        auVar45 = vandps_avx(auVar110,auVar90);
        auVar58 = vandps_avx(auVar110,auVar31);
        auVar45 = vcmpps_avx(auVar45,auVar58,1);
        local_2600[0] = vblendvps_avx(auVar81,auVar37,auVar45);
        fVar26 = local_2620._0_4_ * local_27a0._4_4_ +
                 local_2600[0]._0_4_ * local_2790._4_4_ + fStack_2768 * local_2610._0_4_;
        fVar36 = local_2620._4_4_ * local_27a0._4_4_ +
                 local_2600[0]._4_4_ * local_2790._4_4_ + fStack_2768 * local_2610._4_4_;
        fVar35 = local_2620._8_4_ * local_27a0._4_4_ +
                 local_2600[0]._8_4_ * local_2790._4_4_ + fStack_2768 * local_2610._8_4_;
        fVar42 = local_2620._12_4_ * local_27a0._4_4_ +
                 local_2600[0]._12_4_ * local_2790._4_4_ + fStack_2768 * local_2610._12_4_;
        auVar32._0_4_ = fVar26 + fVar26;
        auVar32._4_4_ = fVar36 + fVar36;
        auVar32._8_4_ = fVar35 + fVar35;
        auVar32._12_4_ = fVar42 + fVar42;
        fVar57 = local_2620._0_4_ * fVar92 +
                 local_2600[0]._0_4_ * fVar137 + local_2610._0_4_ * fVar55;
        fVar43 = local_2620._4_4_ * fVar101 +
                 local_2600[0]._4_4_ * fVar140 + local_2610._4_4_ * fVar66;
        fVar70 = local_2620._8_4_ * fVar102 +
                 local_2600[0]._8_4_ * fVar141 + local_2610._8_4_ * fVar68;
        fVar44 = local_2620._12_4_ * fVar103 +
                 local_2600[0]._12_4_ * fVar142 + local_2610._12_4_ * fVar71;
        auVar45 = vrcpps_avx(auVar32);
        fVar26 = auVar45._0_4_;
        auVar98._0_4_ = auVar32._0_4_ * fVar26;
        fVar36 = auVar45._4_4_;
        auVar98._4_4_ = auVar32._4_4_ * fVar36;
        fVar35 = auVar45._8_4_;
        auVar98._8_4_ = auVar32._8_4_ * fVar35;
        fVar42 = auVar45._12_4_;
        auVar98._12_4_ = auVar32._12_4_ * fVar42;
        auVar111._8_4_ = 0x3f800000;
        auVar111._0_8_ = 0x3f8000003f800000;
        auVar111._12_4_ = 0x3f800000;
        auVar45 = vsubps_avx(auVar111,auVar98);
        auVar99._0_4_ = fVar26 * auVar45._0_4_;
        auVar99._4_4_ = fVar36 * auVar45._4_4_;
        auVar99._8_4_ = fVar35 * auVar45._8_4_;
        auVar99._12_4_ = fVar42 * auVar45._12_4_;
        local_2630._0_4_ = (fVar57 + fVar57) * (fVar26 + auVar99._0_4_);
        local_2630._4_4_ = (fVar43 + fVar43) * (fVar36 + auVar99._4_4_);
        local_2630._8_4_ = (fVar70 + fVar70) * (fVar35 + auVar99._8_4_);
        local_2630._12_4_ = (fVar44 + fVar44) * (fVar42 + auVar99._12_4_);
        auVar34 = ZEXT1664(local_2630);
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar64._4_4_ = uVar16;
        auVar64._0_4_ = uVar16;
        auVar64._8_4_ = uVar16;
        auVar64._12_4_ = uVar16;
        auVar45 = vcmpps_avx(auVar64,local_2630,2);
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar118._4_4_ = uVar16;
        auVar118._0_4_ = uVar16;
        auVar118._8_4_ = uVar16;
        auVar118._12_4_ = uVar16;
        auVar91 = ZEXT1664(auVar118);
        auVar58 = vcmpps_avx(local_2630,auVar118,2);
        auVar45 = vandps_avx(auVar58,auVar45);
        auVar58 = auVar27 & auVar45;
        if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar58[0xf] < '\0') {
          auVar27 = vandps_avx(auVar27,auVar45);
          auVar45 = vcmpps_avx(auVar32,_DAT_01f45a50,4);
          auVar58 = auVar45 & auVar27;
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar58[0xf] < '\0') {
            local_2760 = vandps_avx(auVar27,auVar45);
            local_26a0._16_16_ = local_25b0;
            local_26a0._0_16_ = local_25a0;
            local_2670 = &local_27a1;
            local_2660 = local_2760;
            uStack_2708 = auVar74._8_8_;
            local_2710 = context->scene;
            auVar27 = vrcpps_avx(local_2680);
            fVar26 = auVar27._0_4_;
            auVar51._0_4_ = local_2680._0_4_ * fVar26;
            fVar36 = auVar27._4_4_;
            auVar51._4_4_ = local_2680._4_4_ * fVar36;
            fVar35 = auVar27._8_4_;
            auVar51._8_4_ = local_2680._8_4_ * fVar35;
            fVar42 = auVar27._12_4_;
            auVar51._12_4_ = local_2680._12_4_ * fVar42;
            auVar65._8_4_ = 0x3f800000;
            auVar65._0_8_ = 0x3f8000003f800000;
            auVar65._12_4_ = 0x3f800000;
            auVar27 = vsubps_avx(auVar65,auVar51);
            auVar39._0_4_ = fVar26 + fVar26 * auVar27._0_4_;
            auVar39._4_4_ = fVar36 + fVar36 * auVar27._4_4_;
            auVar39._8_4_ = fVar35 + fVar35 * auVar27._8_4_;
            auVar39._12_4_ = fVar42 + fVar42 * auVar27._12_4_;
            auVar52._8_4_ = 0x219392ef;
            auVar52._0_8_ = 0x219392ef219392ef;
            auVar52._12_4_ = 0x219392ef;
            auVar27 = vcmpps_avx(local_25c0,auVar52,5);
            auVar27 = vandps_avx(auVar27,auVar39);
            auVar53._0_4_ = local_25a0._0_4_ * auVar27._0_4_;
            auVar53._4_4_ = local_25a0._4_4_ * auVar27._4_4_;
            auVar53._8_4_ = local_25a0._8_4_ * auVar27._8_4_;
            auVar53._12_4_ = local_25a0._12_4_ * auVar27._12_4_;
            local_2650 = vminps_avx(auVar53,auVar65);
            auVar40._0_4_ = local_25b0._0_4_ * auVar27._0_4_;
            auVar40._4_4_ = local_25b0._4_4_ * auVar27._4_4_;
            auVar40._8_4_ = local_25b0._8_4_ * auVar27._8_4_;
            auVar40._12_4_ = local_25b0._12_4_ * auVar27._12_4_;
            local_2640 = vminps_avx(auVar40,auVar65);
            auVar54._8_4_ = 0x7f800000;
            auVar54._0_8_ = 0x7f8000007f800000;
            auVar54._12_4_ = 0x7f800000;
            auVar27 = vblendvps_avx(auVar54,local_2630,local_2760);
            auVar45 = vshufps_avx(auVar27,auVar27,0xb1);
            auVar45 = vminps_avx(auVar45,auVar27);
            auVar58 = vshufpd_avx(auVar45,auVar45,1);
            auVar45 = vminps_avx(auVar58,auVar45);
            auVar27 = vcmpps_avx(auVar27,auVar45,0);
            auVar58 = local_2760 & auVar27;
            auVar45 = vpcmpeqd_avx(auVar45,auVar45);
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar45 = auVar27;
            }
            auVar27 = vandps_avx(local_2760,auVar45);
            uVar16 = vmovmskps_avx(auVar27);
            uVar25 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar16);
            local_2770 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> local_2770 & 1) == 0; local_2770 = local_2770 + 1) {
              }
            }
            auVar27 = vpcmpeqd_avx(auVar99,auVar99);
            auVar100 = ZEXT1664(auVar27);
            local_27a0 = lVar22 + uVar18;
            lVar22 = lVar22 + uVar18;
            fStack_2764 = fStack_2768;
LAB_00fdba65:
            uVar15 = *(uint *)(lVar22 + 0x90 + local_2770 * 4);
            lVar22 = *(long *)(*(long *)((long)local_2710 + 0x1e8) + (ulong)uVar15 * 8);
            local_2790 = lVar22;
            if ((*(uint *)(lVar22 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2760 + local_2770 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (*(long *)(lVar22 + 0x40) == 0)) {
                uVar16 = *(undefined4 *)(local_2650 + local_2770 * 4);
                uVar2 = *(undefined4 *)(local_2640 + local_2770 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + local_2770 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2620 + local_2770 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2610 + local_2770 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)(local_2600[0] + local_2770 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar16;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)(local_27a0 + 0xa0 + local_2770 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar15;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00fdbef2;
              }
              uVar16 = *(undefined4 *)(local_2650 + local_2770 * 4);
              local_2520._4_4_ = uVar16;
              local_2520._0_4_ = uVar16;
              local_2520._8_4_ = uVar16;
              local_2520._12_4_ = uVar16;
              local_2510 = *(undefined4 *)(local_2640 + local_2770 * 4);
              pRVar6 = context->user;
              local_2720._0_8_ = pRVar6;
              local_24f0 = vpshufd_avx(ZEXT416(uVar15),0);
              uVar16 = *(undefined4 *)(local_27a0 + 0xa0 + local_2770 * 4);
              local_2500._4_4_ = uVar16;
              local_2500._0_4_ = uVar16;
              local_2500._8_4_ = uVar16;
              local_2500._12_4_ = uVar16;
              uVar16 = *(undefined4 *)(local_2620 + local_2770 * 4);
              uVar2 = *(undefined4 *)(local_2610 + local_2770 * 4);
              local_2540._4_4_ = uVar2;
              local_2540._0_4_ = uVar2;
              local_2540._8_4_ = uVar2;
              local_2540._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_2600[0] + local_2770 * 4);
              local_2530._4_4_ = uVar2;
              local_2530._0_4_ = uVar2;
              local_2530._8_4_ = uVar2;
              local_2530._12_4_ = uVar2;
              local_2550[0] = (RTCHitN)(char)uVar16;
              local_2550[1] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_2550[2] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_2550[3] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_2550[4] = (RTCHitN)(char)uVar16;
              local_2550[5] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_2550[6] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_2550[7] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_2550[8] = (RTCHitN)(char)uVar16;
              local_2550[9] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_2550[10] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_2550[0xb] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              local_2550[0xc] = (RTCHitN)(char)uVar16;
              local_2550[0xd] = (RTCHitN)(char)((uint)uVar16 >> 8);
              local_2550[0xe] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
              local_2550[0xf] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
              uStack_250c = local_2510;
              uStack_2508 = local_2510;
              uStack_2504 = local_2510;
              vcmpps_avx(ZEXT1632(local_2520),ZEXT1632(local_2520),0xf);
              uStack_24dc = pRVar6->instID[0];
              local_24e0 = uStack_24dc;
              uStack_24d8 = uStack_24dc;
              uStack_24d4 = uStack_24dc;
              uStack_24d0 = pRVar6->instPrimID[0];
              uStack_24cc = uStack_24d0;
              uStack_24c8 = uStack_24d0;
              uStack_24c4 = uStack_24d0;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + local_2770 * 4);
              local_2700 = *local_26e8;
              local_26d0.valid = (int *)local_2700;
              local_26d0.geometryUserPtr = *(void **)(lVar22 + 0x18);
              local_26d0.context = context->user;
              local_26d0.hit = local_2550;
              local_26d0.N = 4;
              local_2730 = auVar34._0_16_;
              local_2740 = auVar91._0_16_;
              local_2748 = lVar19;
              local_26d0.ray = (RTCRayN *)ray;
              if (*(code **)(lVar22 + 0x40) != (code *)0x0) {
                auVar27 = auVar100._0_16_;
                (**(code **)(lVar22 + 0x40))(&local_26d0);
                auVar91 = ZEXT1664(local_2740);
                auVar34 = ZEXT1664(local_2730);
                auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                auVar100 = ZEXT1664(auVar27);
                ray = local_2778;
                k = local_2780;
              }
              auVar27 = auVar100._0_16_;
              if (local_2700 == (undefined1  [16])0x0) {
                auVar45 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar45 = auVar45 ^ auVar27;
                lVar19 = local_2748;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_2790 + 0x3e) & 0x40) != 0)))
                   ) {
                  (*p_Var7)(&local_26d0);
                  auVar91 = ZEXT1664(local_2740);
                  auVar34 = ZEXT1664(local_2730);
                  auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                  auVar100 = ZEXT1664(auVar27);
                  ray = local_2778;
                  k = local_2780;
                }
                auVar27 = vpcmpeqd_avx(local_2700,_DAT_01f45a50);
                auVar45 = auVar27 ^ auVar100._0_16_;
                lVar19 = local_2748;
                if (local_2700 != (undefined1  [16])0x0) {
                  auVar27 = auVar27 ^ auVar100._0_16_;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])local_26d0.hit);
                  *(undefined1 (*) [16])(local_26d0.ray + 0xc0) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x10));
                  *(undefined1 (*) [16])(local_26d0.ray + 0xd0) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x20));
                  *(undefined1 (*) [16])(local_26d0.ray + 0xe0) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x30));
                  *(undefined1 (*) [16])(local_26d0.ray + 0xf0) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x40));
                  *(undefined1 (*) [16])(local_26d0.ray + 0x100) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x50));
                  *(undefined1 (*) [16])(local_26d0.ray + 0x110) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x60));
                  *(undefined1 (*) [16])(local_26d0.ray + 0x120) = auVar58;
                  auVar58 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x70));
                  *(undefined1 (*) [16])(local_26d0.ray + 0x130) = auVar58;
                  auVar27 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_26d0.hit + 0x80));
                  *(undefined1 (*) [16])(local_26d0.ray + 0x140) = auVar27;
                }
              }
              auVar33._8_8_ = 0x100000001;
              auVar33._0_8_ = 0x100000001;
              if ((auVar33 & auVar45) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = auVar91._0_4_;
              }
              else {
                auVar91 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_2760 + local_2770 * 4) = 0;
              auVar27 = vshufps_avx(auVar91._0_16_,auVar91._0_16_,0);
              auVar27 = vcmpps_avx(auVar34._0_16_,auVar27,2);
              local_2760 = vandps_avx(auVar27,local_2760);
            }
            if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_2760[0xf]) goto LAB_00fdbef2;
            auVar41._8_4_ = 0x7f800000;
            auVar41._0_8_ = 0x7f8000007f800000;
            auVar41._12_4_ = 0x7f800000;
            auVar27 = vblendvps_avx(auVar41,auVar34._0_16_,local_2760);
            auVar45 = vshufps_avx(auVar27,auVar27,0xb1);
            auVar45 = vminps_avx(auVar45,auVar27);
            auVar58 = vshufpd_avx(auVar45,auVar45,1);
            auVar45 = vminps_avx(auVar58,auVar45);
            auVar45 = vcmpps_avx(auVar27,auVar45,0);
            auVar58 = local_2760 & auVar45;
            auVar27 = local_2760;
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar27 = vandps_avx(auVar45,local_2760);
            }
            uVar16 = vmovmskps_avx(auVar27);
            uVar25 = CONCAT44((int)((ulong)local_2770 >> 0x20),uVar16);
            local_2770 = 0;
            lVar22 = local_27a0;
            if (uVar25 != 0) {
              for (; (uVar25 >> local_2770 & 1) == 0; local_2770 = local_2770 + 1) {
              }
            }
            goto LAB_00fdba65;
          }
        }
      }
LAB_00fdbef2:
      auVar100 = ZEXT3264(local_23c0);
      auVar112 = ZEXT3264(local_23e0);
      auVar119 = ZEXT3264(local_2400);
      auVar121 = ZEXT3264(local_2420);
      auVar126 = ZEXT3264(local_2440);
      auVar130 = ZEXT3264(local_2460);
      auVar133 = ZEXT3264(local_2480);
      auVar139 = ZEXT3264(local_24a0);
      auVar145 = ZEXT3264(local_24c0);
      auVar91 = ZEXT3264(local_25e0);
    }
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar34 = ZEXT3264(CONCAT428(uVar16,CONCAT424(uVar16,CONCAT420(uVar16,CONCAT416(uVar16,CONCAT412
                                                  (uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }